

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

int Acb_ObjSetTravIdDiff(Acb_Ntk_t *p,int i,int d)

{
  int iVar1;
  int r;
  int d_local;
  int i_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjTravIdDiff(p,i);
  Vec_IntWriteEntry(&p->vObjTrav,i,p->nObjTravs - d);
  return iVar1;
}

Assistant:

static inline int            Acb_ObjSetTravIdDiff( Acb_Ntk_t * p, int i, int d )     { int r = Acb_ObjTravIdDiff(p, i);   Vec_IntWriteEntry(&p->vObjTrav, i, p->nObjTravs-d); return r;     }